

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

void Simulator::updateSimSpeed(SimSpeed newSpeed)

{
  TextButton *pTVar1;
  UserInterface *pUVar2;
  long *plVar3;
  undefined8 *puVar4;
  Uint8 blue;
  size_type *psVar5;
  Uint8 green;
  Uint8 red;
  Simulator *in_RSI;
  locale alStack_88 [8];
  String local_80;
  string local_60;
  string local_40;
  
  pUVar2 = userInterfacePtr;
  simSpeed = newSpeed;
  switch(newSpeed) {
  case Paused:
    std::locale::locale((locale *)&local_60);
    sf::String::String(&local_80," Current TPS limit: Paused    ",(locale *)&local_60);
    sf::Text::setString(&(pUVar2->tpsDisplay).text,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
      operator_delete(local_80.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_60);
    green = '\n';
    break;
  case Slow:
    decimalToString_abi_cxx11_(&local_40,in_RSI,config.slowTPSLimit);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x19ad3f);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = puVar4[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_60._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::locale::locale(alStack_88);
    sf::String::String(&local_80,&local_60,alStack_88);
    sf::Text::setString(&(pUVar2->tpsDisplay).text,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
      operator_delete(local_80.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(alStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    green = 0xe6;
    break;
  case Medium:
    decimalToString_abi_cxx11_(&local_40,in_RSI,config.mediumTPSLimit);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x19ad3f);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = plVar3[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_60._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::locale::locale(alStack_88);
    sf::String::String(&local_80,&local_60,alStack_88);
    sf::Text::setString(&(pUVar2->tpsDisplay).text,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
      operator_delete(local_80.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(alStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    red = '\n';
    goto LAB_001281f3;
  case Fast:
    decimalToString_abi_cxx11_(&local_40,in_RSI,config.fastTPSLimit);
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_40,0,(char *)0x0,0x19ad3f);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60.field_2._8_8_ = puVar4[3];
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    }
    else {
      local_60.field_2._M_allocated_capacity = *psVar5;
      local_60._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_60._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    std::locale::locale(alStack_88);
    sf::String::String(&local_80,&local_60,alStack_88);
    sf::Text::setString(&(pUVar2->tpsDisplay).text,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
      operator_delete(local_80.m_string._M_dataplus._M_p);
    }
    std::locale::~locale(alStack_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    red = 0xe6;
LAB_001281f3:
    green = 0xe6;
LAB_001281f8:
    blue = '\n';
    goto LAB_001282b5;
  default:
    std::locale::locale((locale *)&local_60);
    sf::String::String(&local_80," Current TPS limit: Unlimited ",(locale *)&local_60);
    sf::Text::setString(&(pUVar2->tpsDisplay).text,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_80.m_string._M_dataplus._M_p != &local_80.m_string.field_2) {
      operator_delete(local_80.m_string._M_dataplus._M_p);
    }
    std::locale::~locale((locale *)&local_60);
    red = 0xe6;
    green = '\n';
    goto LAB_001281f8;
  }
  red = '\n';
  blue = 0xe6;
LAB_001282b5:
  pTVar1 = &userInterfacePtr->tpsDisplay;
  sf::Color::Color((Color *)&local_80,red,green,blue,0xff);
  sf::Shape::setFillColor(&(pTVar1->button).super_Shape,(Color *)&local_80);
  return;
}

Assistant:

void Simulator::updateSimSpeed(SimSpeed newSpeed) {
    simSpeed = newSpeed;
    if (newSpeed == SimSpeed::Paused) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Paused    ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 10, 230));
    } else if (newSpeed == SimSpeed::Slow) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.slowTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 230));
    } else if (newSpeed == SimSpeed::Medium) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.mediumTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(10, 230, 10));
    } else if (newSpeed == SimSpeed::Fast) {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: " + decimalToString(config.fastTPSLimit));
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 230, 10));
    } else {
        userInterfacePtr->tpsDisplay.text.setString(" Current TPS limit: Unlimited ");
        userInterfacePtr->tpsDisplay.button.setFillColor(Color(230, 10, 10));
    }
}